

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

void __thiscall
gmlc::networking::AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_>::
handshake(AsioSocket<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_> *this)

{
  return;
}

Assistant:

void handshake()
    {
#ifdef GMLC_NETWORKING_ENABLE_ENCRYPTION
        // make sure the socket is an SSL stream, otherwise these methods won't
        // exist
        if constexpr (std::is_base_of<
                          asio::ssl::stream<asio::ip::tcp::socket>,
                          T>::value) {
            socket_.set_verify_mode(asio::ssl::verify_peer);
            socket_.set_verify_callback(
                [](bool preverified, asio::ssl::verify_context& /*ctx*/) {
                    return preverified;
                });
            socket_.handshake(
                handshake_server_ ? asio::ssl::stream_base::server :
                                    asio::ssl::stream_base::client);
        }
#endif
    }